

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TrackJamTargetIdentifier.cpp
# Opt level: O3

void __thiscall
KDIS::DATA_TYPE::TrackJamTargetIdentifier::Decode
          (TrackJamTargetIdentifier *this,KDataStream *stream)

{
  KException *this_00;
  KUINT16 KVar1;
  KString local_40;
  
  KVar1 = KDataStream::GetBufferSize(stream);
  if (7 < KVar1) {
    KDataStream::Read<unsigned_short>
              (stream,&(this->super_EntityIdentifier).super_SimulationIdentifier.m_ui16SiteID);
    KDataStream::Read<unsigned_short>
              (stream,&(this->super_EntityIdentifier).super_SimulationIdentifier.m_ui16ApplicationID
              );
    KDataStream::Read<unsigned_short>
              (stream,(unsigned_short *)
                      &(this->super_EntityIdentifier).super_SimulationIdentifier.field_0xc);
    KDataStream::Read(stream,&(this->super_EntityIdentifier).super_SimulationIdentifier.field_0xe);
    KDataStream::Read(stream,&(this->super_EntityIdentifier).super_SimulationIdentifier.field_0xf);
    return;
  }
  this_00 = (KException *)__cxa_allocate_exception(0x30);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"Decode","");
  KException::KException(this_00,&local_40,2);
  __cxa_throw(this_00,&KException::typeinfo,KException::~KException);
}

Assistant:

void TrackJamTargetIdentifier::Decode(KDataStream &stream) noexcept(false)
{
    if( stream.GetBufferSize() < TRACK_JAM_TARGET_SIZE )throw KException( __FUNCTION__, NOT_ENOUGH_DATA_IN_BUFFER );

    stream >> m_ui16SiteID
           >> m_ui16ApplicationID
           >> m_ui16EntityID
           >> m_ui8EmitterID
           >> m_ui8BeamID;
}